

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::ReleaseNonDefault
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *released_1;
  string *released;
  undefined8 local_80;
  ArenaStringPtr *in_stack_ffffffffffffffa0;
  undefined8 local_10;
  
  bVar1 = IsDonatedString((ArenaStringPtr *)in_RDI);
  if (bVar1) {
    local_10 = (string *)operator_new(0x20);
    pbVar2 = TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x40aaa2);
    std::__cxx11::string::string((string *)local_10,(string *)pbVar2);
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (in_RDI,in_RSI);
  }
  else {
    if (in_RDX == 0) {
      local_80 = UnsafeMutablePointer_abi_cxx11_(in_stack_ffffffffffffffa0);
    }
    else {
      local_80 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)local_80);
      UnsafeMutablePointer_abi_cxx11_(in_stack_ffffffffffffffa0);
      std::__cxx11::string::swap((string *)local_80);
    }
    TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              (in_RDI,in_RSI);
    local_10 = local_80;
  }
  return local_10;
}

Assistant:

std::string* ArenaStringPtr::ReleaseNonDefault(const std::string* default_value,
                                               ::google::protobuf::Arena* arena) {
  GOOGLE_DCHECK(!IsDefault(default_value));

  if (!IsDonatedString()) {
    std::string* released;
    if (arena != nullptr) {
      released = new std::string;
      released->swap(*UnsafeMutablePointer());
    } else {
      released = UnsafeMutablePointer();
    }
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  } else /* IsDonatedString() */ {
    GOOGLE_DCHECK(arena != nullptr);
    std::string* released = new std::string(Get());
    tagged_ptr_.Set(const_cast<std::string*>(default_value));
    return released;
  }
}